

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

bool __thiscall ON_Xform::IsAffine(ON_Xform *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined4 in_EAX;
  int iVar3;
  
  auVar1._4_4_ = -(uint)(this->m_xform[3][1] != 0.0);
  auVar1._0_4_ = -(uint)(this->m_xform[3][0] != 0.0);
  auVar1._8_4_ = -(uint)(this->m_xform[3][2] != 0.0);
  auVar1._12_4_ = -(uint)(this->m_xform[3][3] != 1.0);
  iVar3 = movmskps(in_EAX,auVar1);
  if (iVar3 != 0) {
    return false;
  }
  bVar2 = IsValid(this);
  return bVar2;
}

Assistant:

bool ON_Xform::IsAffine() const
{
  return (
    0.0 == m_xform[3][0] 
    && 0.0 == m_xform[3][1] 
    && 0.0 == m_xform[3][2] 
    && 1.0 == m_xform[3][3] 
    && IsValid());
}